

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

bool __thiscall
GEO::PeriodicDelaunay3dThread::tet_is_real_non_periodic(PeriodicDelaunay3dThread *this,index_t t)

{
  uint uVar1;
  pointer piVar2;
  bool bVar3;
  uint uVar4;
  
  if (((this->cell_next_->
       super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>).
       super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>._M_impl.
       super__Vector_impl_data._M_start[t] != 0xfffffffe) || (bVar3 = tet_is_finite(this,t), !bVar3)
     ) {
    return false;
  }
  uVar4 = t << 2;
  piVar2 = (this->cell_to_v_store_->super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>).
           super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar1 = (this->super_Periodic).nb_vertices_non_periodic_;
  if ((uint)piVar2[uVar4] < uVar1) {
    return true;
  }
  if ((uint)piVar2[(ulong)uVar4 + 1] < uVar1) {
    return true;
  }
  if ((uint)piVar2[(ulong)uVar4 + 2] < uVar1) {
    return true;
  }
  return (uint)piVar2[(ulong)uVar4 + 3] < uVar1;
}

Assistant:

bool tet_is_in_list(index_t t) const {
            geo_debug_assert(t < max_t());
            return (cell_next_[t] != NOT_IN_LIST);
        }